

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O2

int Msat_ClauseCreate(Msat_Solver_t *p,Msat_IntVec_t *vLits,int fLearned,Msat_Clause_t **pClause_out
                     )

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *__src;
  int *piVar4;
  Msat_MmStep_t *p_00;
  Msat_Clause_t *pC;
  Msat_ClauseVec_t **ppMVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  piVar3 = Msat_SolverReadAssignsArray(p);
  *pClause_out = (Msat_Clause_t *)0x0;
  uVar1 = Msat_IntVecReadSize(vLits);
  uVar10 = (ulong)uVar1;
  __src = Msat_IntVecReadArray(vLits);
  uVar9 = uVar10;
  if (fLearned == 0) {
    piVar4 = Msat_SolverReadSeenArray(p);
    iVar2 = Msat_SolverReadDecisionLevel(p);
    if (iVar2 != 0) {
      __assert_fail("Msat_SolverReadDecisionLevel(p) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                    ,0x4e,
                    "int Msat_ClauseCreate(Msat_Solver_t *, Msat_IntVec_t *, int, Msat_Clause_t **)"
                   );
    }
    uVar6 = 0;
    Msat_IntVecSort(vLits,0);
    Msat_SolverIncrementSeenId(p);
    iVar2 = Msat_SolverIncrementSeenId(p);
    if ((int)uVar1 < 1) {
      uVar10 = 0;
    }
    uVar9 = 0;
    for (; iVar8 = (int)uVar9, uVar10 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = __src[uVar6];
      iVar7 = (int)uVar1 >> 1;
      if (piVar4[iVar7] < iVar2 + -1) {
        piVar4[iVar7] = iVar2 - (~uVar1 & 1);
        if (piVar3[iVar7] == -1) {
          uVar9 = (ulong)(iVar8 + 1);
          __src[iVar8] = __src[uVar6];
        }
        else if (piVar3[iVar7] == __src[uVar6]) {
          return 1;
        }
      }
      else if (((piVar4[iVar7] == iVar2 ^ (byte)uVar1) & 1) == 0) {
        return 1;
      }
    }
    Msat_IntVecShrink(vLits,iVar8);
  }
  uVar1 = (uint)uVar9;
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    if (uVar1 == 1) {
      iVar2 = Msat_SolverEnqueue(p,*__src,(Msat_Clause_t *)0x0);
      return iVar2;
    }
    p_00 = Msat_SolverReadMem(p);
    pC = (Msat_Clause_t *)Msat_MmStepEntryFetch(p_00,(uVar1 + fLearned) * 4 + 8);
    iVar2 = p->nClauses;
    p->nClauses = iVar2 + 1;
    pC->Num = iVar2;
    *(uint *)&pC->field_0x4 =
         (fLearned & 1U) + (uVar1 & 0x3fff) * 8 | (uVar1 + fLearned + 2) * 0x80000;
    memcpy(pC + 1,__src,(long)(int)uVar1 * 4);
    if (fLearned != 0) {
      uVar10 = 1;
      piVar3 = Msat_SolverReadDecisionLevelArray(p);
      iVar2 = piVar3[__src[1] >> 1];
      for (uVar6 = 2; (long)uVar6 < (long)(int)uVar1; uVar6 = uVar6 + 1) {
        iVar8 = piVar3[__src[uVar6] >> 1];
        if (iVar8 == -1) {
          __assert_fail("iLevelCur != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                        ,0xb6,
                        "int Msat_ClauseCreate(Msat_Solver_t *, Msat_IntVec_t *, int, Msat_Clause_t **)"
                       );
        }
        iVar7 = iVar2;
        if (iVar2 <= iVar8) {
          iVar7 = iVar8;
        }
        if (iVar2 < iVar8) {
          uVar10 = uVar6;
        }
        uVar10 = uVar10 & 0xffffffff;
        iVar2 = iVar7;
      }
      *(int *)&pC[1].field_0x4 = __src[(int)uVar10];
      (&pC[1].Num)[(int)uVar10] = __src[1];
      *(undefined4 *)((long)&pC[1].Num + (ulong)(*(uint *)&pC->field_0x4 >> 1 & 0xfffc)) = 0;
      Msat_SolverClaBumpActivity(p,pC);
      uVar10 = 0;
      if ((int)uVar1 < 1) {
        uVar9 = 0;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        Msat_SolverVarBumpActivity(p,__src[uVar10]);
      }
    }
    ppMVar5 = Msat_SolverReadWatchedArray(p);
    Msat_ClauseVecPush(ppMVar5[(long)pC[1].Num ^ 1],pC);
    Msat_ClauseVecPush(ppMVar5[(long)*(int *)&pC[1].field_0x4 ^ 1],pC);
    *pClause_out = pC;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int  Msat_ClauseCreate( Msat_Solver_t * p, Msat_IntVec_t * vLits, int  fLearned, Msat_Clause_t ** pClause_out )
{
    int * pAssigns = Msat_SolverReadAssignsArray(p);
    Msat_ClauseVec_t ** pvWatched;
    Msat_Clause_t * pC;
    int * pLits;
    int nLits, i, j;
    int nBytes;
    Msat_Var_t Var;
    int  Sign;

    *pClause_out = NULL;

    nLits = Msat_IntVecReadSize(vLits);
    pLits = Msat_IntVecReadArray(vLits);

    if ( !fLearned ) 
    {
        int * pSeen = Msat_SolverReadSeenArray( p );
        int nSeenId;
        assert( Msat_SolverReadDecisionLevel(p) == 0 );
        // sorting literals makes the code trace-equivalent 
        // with to the original C++ solver
        Msat_IntVecSort( vLits, 0 );
        // increment the counter of seen twice
        nSeenId = Msat_SolverIncrementSeenId( p );
        nSeenId = Msat_SolverIncrementSeenId( p );
        // nSeenId - 1 stands for negative
        // nSeenId     stands for positive
        // Remove false literals

        // there is a bug here!!!!
        // when the same var in opposite polarities is given, it drops one polarity!!!

        for ( i = j = 0; i < nLits; i++ ) {
            // get the corresponding variable
            Var  = MSAT_LIT2VAR(pLits[i]);
            Sign = MSAT_LITSIGN(pLits[i]); // Sign=0 for positive
            // check if we already saw this variable in the this clause
            if ( pSeen[Var] >= nSeenId - 1 )
            {
                if ( (pSeen[Var] != nSeenId) == Sign ) // the same lit
                    continue;
                return 1; // two opposite polarity lits -- don't add the clause
            }
            // mark the variable as seen
            pSeen[Var] = nSeenId - !Sign;

            // analize the value of this literal
            if ( pAssigns[Var] != MSAT_VAR_UNASSIGNED )
            {
                if ( pAssigns[Var] == pLits[i] )
                    return 1;  // the clause is always true -- don't add anything
                // the literal has no impact - skip it
                continue;
            }
            // otherwise, add this literal to the clause
            pLits[j++] = pLits[i];
        }
        Msat_IntVecShrink( vLits, j );
        nLits = j;
/*
        // the problem with this code is that performance is very
        // sensitive to the ordering of adjacency lits
        // the best ordering requires fanins first, next fanouts
        // this ordering is more convenient to make from FRAIG

        // create the adjacency information
        if ( nLits > 2 )
        {
            Msat_Var_t VarI, VarJ;
            Msat_IntVec_t * pAdjI, * pAdjJ;

            for ( i = 0; i < nLits; i++ )
            {
                VarI = MSAT_LIT2VAR(pLits[i]);
                pAdjI = (Msat_IntVec_t *)p->vAdjacents->pArray[VarI];

                for ( j = i+1; j < nLits; j++ )
                {
                    VarJ = MSAT_LIT2VAR(pLits[j]);
                    pAdjJ = (Msat_IntVec_t *)p->vAdjacents->pArray[VarJ];

                    Msat_IntVecPushUniqueOrder( pAdjI, VarJ, 1 );
                    Msat_IntVecPushUniqueOrder( pAdjJ, VarI, 1 );
                }
            }
        }
*/
    }
    // 'vLits' is now the (possibly) reduced vector of literals.
    if ( nLits == 0 )
        return 0;
    if ( nLits == 1 )
        return Msat_SolverEnqueue( p, pLits[0], NULL );

    // Allocate clause:
//    nBytes = sizeof(unsigned)*(nLits + 1 + (int)fLearned);
    nBytes = sizeof(unsigned)*(nLits + 2 + (int)fLearned);
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    pC = (Msat_Clause_t *)ABC_ALLOC( char, nBytes );
#else
    pC = (Msat_Clause_t *)Msat_MmStepEntryFetch( Msat_SolverReadMem(p), nBytes );
#endif
    pC->Num        = p->nClauses++;
    pC->fTypeA     = 0;
    pC->fMark      = 0;
    pC->fLearned   = fLearned;
    pC->nSize      = nLits;
    pC->nSizeAlloc = nBytes;
    memcpy( pC->pData, pLits, sizeof(int)*nLits );

    // For learnt clauses only:
    if ( fLearned )
    {
        int * pLevel = Msat_SolverReadDecisionLevelArray( p );
        int iLevelMax, iLevelCur, iLitMax;

        // Put the second watch on the literal with highest decision level:
        iLitMax = 1;
        iLevelMax = pLevel[ MSAT_LIT2VAR(pLits[1]) ];
        for ( i = 2; i < nLits; i++ )
        {
            iLevelCur = pLevel[ MSAT_LIT2VAR(pLits[i]) ];
            assert( iLevelCur != -1 );
            if ( iLevelMax < iLevelCur )
            // this is very strange - shouldn't it be???
            // if ( iLevelMax > iLevelCur )
                iLevelMax = iLevelCur, iLitMax = i;
        }
        pC->pData[1]       = pLits[iLitMax];
        pC->pData[iLitMax] = pLits[1];

        // Bumping:
        // (newly learnt clauses should be considered active)
        Msat_ClauseWriteActivity( pC, 0.0 );
        Msat_SolverClaBumpActivity( p, pC ); 
//        if ( nLits < 20 )
        for ( i = 0; i < nLits; i++ )
        {
            Msat_SolverVarBumpActivity( p, pLits[i] );
//            Msat_SolverVarBumpActivity( p, pLits[i] );
//            p->pFreq[ MSAT_LIT2VAR(pLits[i]) ]++;
        }
    }

    // Store clause:
    pvWatched = Msat_SolverReadWatchedArray( p );
    Msat_ClauseVecPush( pvWatched[ MSAT_LITNOT(pC->pData[0]) ], pC );
    Msat_ClauseVecPush( pvWatched[ MSAT_LITNOT(pC->pData[1]) ], pC );
    *pClause_out = pC;
    return 1;
}